

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

bool __thiscall
math::wide_integer::uintwide_t<512u,unsigned_int,void,false>::wr_string<char*>
          (uintwide_t<512u,unsigned_int,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  long lVar9;
  uintwide_t<24U,_unsigned_char,_void,_false> *v;
  unsigned_fast_type uVar10;
  int iVar11;
  undefined7 in_register_00000011;
  ulong uVar12;
  uintwide_t<24U,_unsigned_char,_void,_false> t;
  value_type_conflict vStack_1f4;
  byte local_1ab [134];
  undefined1 local_125;
  char local_124 [27];
  undefined1 local_109;
  undefined1 local_108;
  undefined1 local_fa;
  undefined1 local_f9;
  uintwide_t<512U,_unsigned_int,_void,_false> local_f8;
  uintwide_t<24U,_unsigned_char,_void,_false> tmp;
  value_type_conflict vStack_b4;
  wide_integer local_70 [64];
  
  iVar11 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar11 == 0x10) {
    _t = *(undefined8 *)this;
    memset(local_1ab,0,0x88);
    bVar8 = uintwide_t<512U,_unsigned_int,_void,_false>::is_zero(&t);
    if (bVar8) {
      local_125 = 0x30;
      uVar12 = 0x86;
    }
    else {
      uVar10 = uintwide_t<512U,_unsigned_int,_void,_false>::extract_hex_digits<false,_nullptr>
                         (&t,local_124,is_uppercase);
      uVar12 = 0x87 - uVar10;
    }
    if ((show_base) && (1 < (long)uVar12)) {
      local_1ab[(int)uVar12 - 1] = !is_uppercase << 5 | 0x58;
      uVar12 = uVar12 - 2;
      local_1ab[uVar12 & 0xffffffff] = 0x30;
    }
    if ((show_pos) && (0 < (long)uVar12)) {
      uVar12 = uVar12 - 1;
      local_1ab[uVar12 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar9 = 0;
      if (field_width < 0x88) {
        lVar9 = 0x87 - field_width;
      }
      while (lVar9 < (long)uVar12) {
        uVar12 = uVar12 - 1;
        local_1ab[uVar12 & 0xffffffff] = fill_char_str;
      }
    }
    local_124[0] = '\0';
  }
  else if (iVar11 == 10) {
    _t = *(undefined8 *)this;
    uVar1 = *(undefined8 *)(this + 8);
    uVar2 = *(undefined8 *)(this + 0x10);
    uVar3 = *(undefined8 *)(this + 0x18);
    uVar4 = *(undefined8 *)(this + 0x20);
    uVar5 = *(undefined8 *)(this + 0x28);
    uVar6 = *(undefined8 *)(this + 0x30);
    uVar7 = *(undefined8 *)(this + 0x38);
    uVar12 = 0xa3;
    memset(local_1ab,0,0xa3);
    bVar8 = uintwide_t<512U,_unsigned_int,_void,_false>::is_zero(&t);
    if (bVar8) {
      local_109 = 0x30;
      uVar12 = 0xa2;
    }
    else {
      while ((bVar8 = uintwide_t<512U,_unsigned_int,_void,_false>::is_zero(&t), uVar12 != 0 &&
             (!bVar8))) {
        _tmp = _t;
        vStack_b4 = vStack_1f4;
        uintwide_t<512U,_unsigned_int,_void,_false>::eval_divide_by_single_limb
                  ((uintwide_t<512U,_unsigned_int,_void,_false> *)&t,10,0,
                   (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0);
        local_f8.values.super_array<unsigned_int,_16UL>.elems[0] = _t;
        local_f8.values.super_array<unsigned_int,_16UL>.elems[1] = vStack_1f4;
        local_f8.values.super_array<unsigned_int,_16UL>.elems._8_8_ = uVar1;
        local_f8.values.super_array<unsigned_int,_16UL>.elems._16_8_ = uVar2;
        local_f8.values.super_array<unsigned_int,_16UL>.elems._24_8_ = uVar3;
        local_f8.values.super_array<unsigned_int,_16UL>.elems._32_8_ = uVar4;
        local_f8.values.super_array<unsigned_int,_16UL>.elems._40_8_ = uVar5;
        local_f8.values.super_array<unsigned_int,_16UL>.elems._48_8_ = uVar6;
        local_f8.values.super_array<unsigned_int,_16UL>.elems._56_8_ = uVar7;
        v = uintwide_t<512U,_unsigned_int,_void,_false>::mul_by_limb(&local_f8,10);
        wide_integer::operator-(local_70,&tmp,v);
        uVar12 = uVar12 - 1;
        local_1ab[uVar12 & 0xffffffff] = (char)local_70[0] + 0x30;
      }
    }
    if (show_pos && uVar12 != 0) {
      uVar12 = uVar12 - 1;
      local_1ab[uVar12 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar9 = 0;
      if (field_width < 0xa4) {
        lVar9 = 0xa3 - field_width;
      }
      while (lVar9 < (long)uVar12) {
        uVar12 = uVar12 - 1;
        local_1ab[uVar12 & 0xffffffff] = fill_char_str;
      }
    }
    local_108 = 0;
  }
  else {
    if (iVar11 != 8) {
      return false;
    }
    _t = *(undefined8 *)this;
    uVar12 = 0xb2;
    memset(local_1ab,0,0xb2);
    bVar8 = uintwide_t<512U,_unsigned_int,_void,_false>::is_zero(&t);
    if (bVar8) {
      local_fa = 0x30;
      uVar12 = 0xb1;
    }
    else {
      while ((bVar8 = uintwide_t<512U,_unsigned_int,_void,_false>::is_zero(&t), uVar12 != 0 &&
             (!bVar8))) {
        uVar12 = uVar12 - 1;
        local_1ab[uVar12 & 0xffffffff] =
             t.values.super_array<unsigned_char,_3UL>.elems[0] & 7 | 0x30;
        operator>>=((uintwide_t<512u,unsigned_int,void,false> *)&t,3);
      }
    }
    if (show_base && uVar12 != 0) {
      uVar12 = uVar12 - 1;
      local_1ab[uVar12 & 0xffffffff] = 0x30;
    }
    if (show_pos && uVar12 != 0) {
      uVar12 = uVar12 - 1;
      local_1ab[uVar12 & 0xffffffff] = 0x2b;
    }
    if (field_width != 0) {
      lVar9 = 0;
      if (field_width < 0xb3) {
        lVar9 = 0xb2 - field_width;
      }
      while (lVar9 < (long)uVar12) {
        uVar12 = uVar12 - 1;
        local_1ab[uVar12 & 0xffffffff] = fill_char_str;
      }
    }
    local_f9 = 0;
  }
  detail::strcpy_unsafe<char*,char*>(str_result,(char *)(local_1ab + uVar12));
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }